

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  pointer puVar1;
  cmLocalGenerator *pcVar2;
  pointer puVar3;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  pointer puVar7;
  __uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> this_00;
  pointer puVar8;
  string fname;
  cmGeneratedFileStream fout;
  string local_2e8;
  cmAlphaNum local_2c8;
  undefined1 local_298 [616];
  
  psVar5 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  local_298._8_8_ = (psVar5->_M_dataplus)._M_p;
  local_298._0_8_ = psVar5->_M_string_length;
  local_2c8.View_._M_len = 0x21;
  local_2c8.View_._M_str = "/CMakeFiles/TargetDirectories.txt";
  cmStrCat<>(&local_2e8,(cmAlphaNum *)local_298,&local_2c8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_2e8,false,None);
  puVar1 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->LocalGenerators).
                super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    pcVar2 = (puVar8->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar3 = *(pointer *)
              ((long)&(pcVar2->GeneratorTargets).
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              + 8);
    for (puVar7 = *(pointer *)
                   &(pcVar2->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                    ._M_impl; puVar7 != puVar3; puVar7 = puVar7 + 1) {
      this_00._M_t.
      super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
      super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
           (puVar7->_M_t).
           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t;
      bVar4 = cmGeneratorTarget::IsInBuildSystem
                        ((cmGeneratorTarget *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                         .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      if (bVar4) {
        WriteSummary((cmGlobalGenerator *)
                     this_00._M_t.
                     super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                     .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                     (cmGeneratorTarget *)
                     (puVar7->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                    );
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                  ((string *)&local_2c8,
                   (cmGeneratorTarget *)
                   (puVar7->_M_t).
                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  );
        poVar6 = std::operator<<((ostream *)local_298,(string *)&local_2c8);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_2c8);
      }
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  std::__cxx11::string::~string((string *)&local_2e8);
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  // Record all target directories in a central location.
  std::string fname = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                               "/CMakeFiles/TargetDirectories.txt");
  cmGeneratedFileStream fout(fname);

  for (const auto& lg : this->LocalGenerators) {
    for (const auto& tgt : lg->GetGeneratorTargets()) {
      if (!tgt->IsInBuildSystem()) {
        continue;
      }
      this->WriteSummary(tgt.get());
      fout << tgt->GetSupportDirectory() << "\n";
    }
  }
}